

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O2

double __thiscall VCTools::InputParser::getFloatArg(InputParser *this,string *arg,double def)

{
  bool bVar1;
  string nr;
  double local_30;
  string local_28;
  
  getCmdOption(&local_28,this,arg);
  local_30 = def;
  if (local_28._M_string_length != 0) {
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,VCTools::InputParser::getFloatArg(std::__cxx11::string_const&,double)::_lambda(unsigned_char)_1_>
                      (local_28._M_dataplus._M_p,
                       local_28._M_dataplus._M_p + local_28._M_string_length);
    if (bVar1) {
      local_30 = atof(local_28._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::~string((string *)&local_28);
  return local_30;
}

Assistant:

double getFloatArg(const string& arg, double def = -1) {
			string nr = getCmdOption(arg);
			if (nr.size() > 0 && std::all_of(nr.begin(), nr.end(), 
				[](unsigned char c) {return ::isdigit(c) || c == '.'; }))
				return atof(nr.c_str());
			return def;
		}